

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O2

void __thiscall embree::TutorialApplication::run(TutorialApplication *this,int argc,char **argv)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  rtcSetDeviceProperty(0,1000000,(long)this->debug0);
  rtcSetDeviceProperty(0,0xf4241,(long)this->debug1);
  rtcSetDeviceProperty(0,0xf4242,(long)this->debug2);
  rtcSetDeviceProperty(0,0xf4243,(long)this->debug3);
  device_init((this->super_Application).rtcore._M_dataplus._M_p);
  std::__cxx11::string::string((string *)&local_40,(string *)&this->outputImageFilename);
  bVar1 = std::operator!=(&local_40,"");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    renderToFile(this,&this->outputImageFilename);
  }
  std::__cxx11::string::string((string *)&local_40,(string *)&this->referenceImageFilename);
  bVar1 = std::operator!=(&local_40,"");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    compareToReferenceImage(this,&this->referenceImageFilename);
  }
  if (this->interactive == true) {
    renderInteractive(this);
  }
  return;
}

Assistant:

void TutorialApplication::run(int argc, char** argv)
  {
    /* set debug values */
    rtcSetDeviceProperty(nullptr,(RTCDeviceProperty) 1000000, debug0);
    rtcSetDeviceProperty(nullptr,(RTCDeviceProperty) 1000001, debug1);
    rtcSetDeviceProperty(nullptr,(RTCDeviceProperty) 1000002, debug2);
    rtcSetDeviceProperty(nullptr,(RTCDeviceProperty) 1000003, debug3);

    /* initialize ray tracing core */
    device_init(rtcore.c_str());

    /* render to disk */
    if (outputImageFilename.str() != "")
      renderToFile(outputImageFilename);

    /* compare to reference image */
    if (referenceImageFilename.str() != "")
      compareToReferenceImage(referenceImageFilename);

#if defined(USE_GLFW)
    
    /* interactive mode */
    if (interactive)
      renderInteractive();
    
#else
    if (interactive) 
      std::cout << "GLFW is disabled, you can only render to disk using -o command line option." << std::endl;
#endif
  }